

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O0

Container * __thiscall Container::add(Container *this,Person *person)

{
  Person *local_18;
  Person *person_local;
  Container *this_local;
  
  local_18 = person;
  person_local = (Person *)this;
  std::__cxx11::list<Person_*,_std::allocator<Person_*>_>::push_back(&this->people,&local_18);
  return this;
}

Assistant:

Container& Container::add(Person* person){
    people.push_back(person);
    return *this;
}